

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int gz_comp(gz_statep state,int flush)

{
  int iVar1;
  ssize_t sVar2;
  uchar *puVar3;
  int *piVar4;
  char *msg;
  uchar *puVar5;
  uint uVar6;
  size_t __n;
  Bytef *__buf;
  uInt uVar7;
  uInt uVar8;
  
  if ((state->size == 0) && (iVar1 = gz_init(state), iVar1 == -1)) {
LAB_00108b26:
    iVar1 = -1;
  }
  else if (state->direct == 0) {
    if (state->reset != 0) {
      if ((state->strm).avail_in == 0) {
        return 0;
      }
      deflateReset(&state->strm);
      state->reset = 0;
    }
    uVar7 = (state->strm).avail_out;
    iVar1 = 0;
    do {
      uVar8 = uVar7;
      if (uVar7 == 0) {
LAB_00108a49:
        puVar3 = (state->x).next;
        puVar5 = (state->strm).next_out;
        if (puVar3 < puVar5) {
          do {
            __n = (long)puVar5 - (long)puVar3 & 0xffffffff;
            if (0x40000000 < (long)puVar5 - (long)puVar3) {
              __n = 0x40000000;
            }
            sVar2 = write(state->fd,puVar3,__n);
            if ((int)(uint)sVar2 < 0) goto LAB_00108ae9;
            puVar3 = (state->x).next + ((uint)sVar2 & 0x7fffffff);
            (state->x).next = puVar3;
            puVar5 = (state->strm).next_out;
          } while (puVar3 < puVar5);
          uVar8 = (state->strm).avail_out;
        }
        if (uVar8 == 0) {
          uVar8 = state->size;
          (state->strm).avail_out = uVar8;
          puVar3 = state->out;
          (state->strm).next_out = puVar3;
          (state->x).next = puVar3;
        }
      }
      else if ((flush != 0) && (flush != 4 || iVar1 == 1)) goto LAB_00108a49;
      iVar1 = deflate(&state->strm,flush);
      if (iVar1 == -2) {
        gz_error(state,-2,"internal error: deflate stream corrupt");
        goto LAB_00108b26;
      }
      uVar7 = (state->strm).avail_out;
    } while (uVar8 != uVar7);
    iVar1 = 0;
    if (flush == 4) {
      state->reset = 1;
    }
  }
  else {
    uVar6 = (state->strm).avail_in;
    iVar1 = 0;
    if (uVar6 != 0) {
      __buf = (state->strm).next_in;
      do {
        if (0x3fffffff < uVar6) {
          uVar6 = 0x40000000;
        }
        sVar2 = write(state->fd,__buf,(ulong)uVar6);
        uVar6 = (uint)sVar2;
        if ((int)uVar6 < 0) {
LAB_00108ae9:
          piVar4 = __errno_location();
          msg = strerror(*piVar4);
          gz_error(state,-1,msg);
          return -1;
        }
        __buf = (state->strm).next_in + (uVar6 & 0x7fffffff);
        uVar6 = (state->strm).avail_in - uVar6;
        (state->strm).avail_in = uVar6;
        (state->strm).next_in = __buf;
        iVar1 = 0;
      } while (uVar6 != 0);
    }
  }
  return iVar1;
}

Assistant:

local int gz_comp(gz_statep state, int flush) {
    int ret, writ;
    unsigned have, put, max = ((unsigned)-1 >> 2) + 1;
    z_streamp strm = &(state->strm);

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return -1;

    /* write directly if requested */
    if (state->direct) {
        while (strm->avail_in) {
            put = strm->avail_in > max ? max : strm->avail_in;
            writ = write(state->fd, strm->next_in, put);
            if (writ < 0) {
                gz_error(state, Z_ERRNO, zstrerror());
                return -1;
            }
            strm->avail_in -= (unsigned)writ;
            strm->next_in += writ;
        }
        return 0;
    }

    /* check for a pending reset */
    if (state->reset) {
        /* don't start a new gzip member unless there is data to write */
        if (strm->avail_in == 0)
            return 0;
        deflateReset(strm);
        state->reset = 0;
    }

    /* run deflate() on provided input until it produces no more output */
    ret = Z_OK;
    do {
        /* write out current buffer contents if full, or if flushing, but if
           doing Z_FINISH then don't write until we get to Z_STREAM_END */
        if (strm->avail_out == 0 || (flush != Z_NO_FLUSH &&
            (flush != Z_FINISH || ret == Z_STREAM_END))) {
            while (strm->next_out > state->x.next) {
                put = strm->next_out - state->x.next > (int)max ? max :
                      (unsigned)(strm->next_out - state->x.next);
                writ = write(state->fd, state->x.next, put);
                if (writ < 0) {
                    gz_error(state, Z_ERRNO, zstrerror());
                    return -1;
                }
                state->x.next += writ;
            }
            if (strm->avail_out == 0) {
                strm->avail_out = state->size;
                strm->next_out = state->out;
                state->x.next = state->out;
            }
        }

        /* compress */
        have = strm->avail_out;
        ret = deflate(strm, flush);
        if (ret == Z_STREAM_ERROR) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: deflate stream corrupt");
            return -1;
        }
        have -= strm->avail_out;
    } while (have);

    /* if that completed a deflate stream, allow another to start */
    if (flush == Z_FINISH)
        state->reset = 1;

    /* all done, no errors */
    return 0;
}